

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall
DivideTest<unsigned_long>::test_many<(libdivide::Branching)1>
          (DivideTest<unsigned_long> *this,unsigned_long denom)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong extraout_RAX;
  int j;
  long lVar4;
  int i_1;
  DivideTest<unsigned_long> *unaff_R14;
  int32_t i;
  unsigned_long uVar5;
  divider<unsigned_long,_(libdivide::Branching)1> the_divider;
  divider<unsigned_long,_(libdivide::Branching)1> local_60;
  string_class local_50;
  
  if (denom == 1) {
    return;
  }
  if (denom == 0) {
    test_many<(libdivide::Branching)1>();
    uVar3 = extraout_RAX;
  }
  else {
    if ((denom - 1 & denom) == 0) {
      local_60.div.denom.more = 0x3e - (byte)LZCOUNT(denom);
      local_60.div.denom.magic = 0;
    }
    else {
      local_60.div.denom.more = (byte)LZCOUNT(denom) ^ 0x3f;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = denom;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = 1L << ((ulong)local_60.div.denom.more & 0x3f);
      lVar4 = SUB168((auVar2 << 0x40) % auVar1,0);
      local_60.div.denom.magic = (ulong)(lVar4 < 0 || denom <= (ulong)(lVar4 * 2)) + 1;
    }
    local_60.div.denom.more = local_60.div.denom.more & 0x3f;
    uVar3 = libdivide::divider<unsigned_long,_(libdivide::Branching)1>::recover(&local_60);
    unaff_R14 = this;
    if (uVar3 == denom) {
      lVar4 = 0;
      do {
        test_one<(libdivide::Branching)1>
                  (this,*(unsigned_long *)((long)edgeCases + lVar4),denom,&local_60);
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x2e0);
      uVar5 = 0;
      do {
        test_one<(libdivide::Branching)1>(this,uVar5,denom,&local_60);
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x10000);
      uVar3 = 1;
      do {
        lVar4 = -1;
        do {
          test_one<(libdivide::Branching)1>(this,(1L << (uVar3 & 0x3f)) + lVar4,denom,&local_60);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 2);
        uVar3 = uVar3 + 1;
      } while (uVar3 != 0x40);
      uVar5 = 0xffffffffffffffff;
      do {
        test_one<(libdivide::Branching)1>(this,uVar5,denom,&local_60);
        uVar5 = uVar5 * 2;
      } while (uVar5 != 0);
      test_random_numerators<(libdivide::Branching)1>(this,denom,&local_60);
      test_vectordivide_numerators<(libdivide::Branching)1>(this,denom,&local_60);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Failed to recover divisor for ",0x1e);
  testcase_name_abi_cxx11_(&local_50,unaff_R14,1);
  std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator<<((ostream *)&std::cerr,": ");
  std::ostream::operator<<((ostream *)&std::cerr,denom);
  std::operator<<((ostream *)&std::cerr,", but got ");
  std::ostream::operator<<((ostream *)&std::cerr,uVar3);
  std::operator<<((ostream *)&std::cerr,"\n");
  exit(1);
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }